

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall
program_options::invalid_bool_value::invalid_bool_value(invalid_bool_value *this,string *bad_value)

{
  string *in_RDI;
  string *value;
  error_with_option_name *this_00;
  allocator<char> local_91;
  string local_90 [16];
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string local_68 [4];
  kind_t in_stack_ffffffffffffff9c;
  validation_error *in_stack_ffffffffffffffa0;
  undefined1 local_31 [49];
  
  this_00 = (error_with_option_name *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  value = (string *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  validation_error::validation_error
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *(undefined ***)in_RDI = &PTR__invalid_bool_value_00249ad8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  error_with_option_name::set_substitute(this_00,in_RDI,value);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

invalid_bool_value::invalid_bool_value(const std::string& bad_value)
: validation_error(validation_error::invalid_bool_value)
{
    set_substitute("value", bad_value);
}